

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::FileGenerator::GeneratePBHeader
          (FileGenerator *this,Printer *p,string_view info_path)

{
  anon_class_24_3_70aec331 local_60;
  function<void_()> local_48;
  Printer *local_28;
  Printer *p_local;
  FileGenerator *this_local;
  string_view info_path_local;
  
  info_path_local._M_len = (size_t)info_path._M_str;
  this_local = (FileGenerator *)info_path._M_len;
  local_60.p = &local_28;
  local_60.info_path = (string_view *)&this_local;
  local_60.this = this;
  local_28 = p;
  p_local = (Printer *)this;
  std::function<void()>::
  function<google::protobuf::compiler::cpp::FileGenerator::GeneratePBHeader(google::protobuf::io::Printer*,std::basic_string_view<char,std::char_traits<char>>)::__0,void>
            ((function<void()> *)&local_48,&local_60);
  GenerateFile(this,p,kPbH,&local_48);
  std::function<void_()>::~function(&local_48);
  return;
}

Assistant:

void FileGenerator::GeneratePBHeader(io::Printer* p,
                                     absl::string_view info_path) {
  GenerateFile(p, GeneratedFileType::kPbH, [&] {
    p->Emit(
        {
            {"library_includes",
             [&] {
               if (options_.proto_h) {
                 std::string target_basename = StripProto(file_->name());
                 if (!options_.opensource_runtime) {
                   GetBootstrapBasename(options_, target_basename,
                                        &target_basename);
                 }
                 p->Emit({{"name", target_basename}}, R"(
              #include "$name$.proto.h"  // IWYU pragma: export
              )");
               } else {
                 GenerateLibraryIncludes(p);
               }
             }},
            {"proto_includes",
             [&] {
               if (options_.transitive_pb_h) {
                 GenerateDependencyIncludes(p);
               }
             }},
            {"metadata_pragma", [&] { GenerateMetadataPragma(p, info_path); }},
            {"header_main",
             [&] {
               if (!options_.proto_h) {
                 GenerateSharedHeaderCode(p);
                 return;
               }

               {
                 NamespaceOpener ns(Namespace(file_, options_), p);
                 p->Emit(R"cc(

                   // @@protoc_insertion_point(namespace_scope)
                 )cc");
               }
               p->Emit(R"cc(

                 // @@protoc_insertion_point(global_scope)
               )cc");
             }},
        },
        R"cc(
          $library_includes$;
          $proto_includes$;
          // @@protoc_insertion_point(includes)

          $metadata_pragma$;
          $header_main$;
        )cc");
  });
}